

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void gl4cts::CopyImage::Utils::prepareTexture
               (Context *context,GLuint name,GLenum target,GLenum internal_format,GLenum format,
               GLenum type,GLuint level,GLuint width,GLuint height,GLuint depth,GLvoid *pixels,
               GLuint *out_buf_id)

{
  ostringstream *stream;
  ostringstream *this;
  GLuint GVar1;
  GLuint GVar2;
  int iVar3;
  GLenum GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  TestError *this_00;
  long lVar8;
  GLenum GVar9;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  undefined8 uVar10;
  undefined8 uVar11;
  GLvoid *pGVar12;
  GLchar *function_name;
  undefined8 local_220;
  undefined8 local_218;
  GLvoid *local_210;
  GLuint local_208;
  GLuint local_204;
  Context *local_200;
  char *local_1f8;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  local_218 = CONCAT44(in_register_0000008c,type);
  local_220 = CONCAT44(in_register_00000084,format);
  local_210 = pixels;
  function_name = "unknown";
  local_200 = context;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  GVar4 = transProxyToRealTarget(target);
  if ((int)GVar4 < 0x8c18) {
    if ((int)GVar4 < 0x84f5) {
      if (GVar4 == 0xde0) {
        GVar4 = 0xde0;
        (**(code **)(lVar6 + 0xb8))(0xde0,name);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"BindTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                        ,0x61b);
        (**(code **)(lVar6 + 0x1308))
                  (0xde0,level,internal_format,width,0,local_220,local_218,local_210);
        iVar3 = (**(code **)(lVar6 + 0x800))();
        function_name = "TexImage1D";
        goto LAB_0088616e;
      }
      if (GVar4 != 0xde1) {
        if (GVar4 == 0x806f) goto LAB_00885f2a;
        goto LAB_008860ba;
      }
LAB_008860fb:
      (**(code **)(lVar6 + 0xb8))(GVar4,name);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x628);
      uVar10 = local_220;
      uVar11 = local_218;
      pGVar12 = local_210;
      GVar9 = GVar4;
    }
    else {
      if (5 < GVar4 - 0x8515) {
        if (GVar4 == 0x84f5) goto LAB_008860fb;
        if (GVar4 != 0x8513) goto LAB_008860ba;
      }
      (**(code **)(lVar6 + 0xb8))(0x8513,name);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x679);
      pGVar12 = local_210;
      uVar11 = local_218;
      uVar10 = local_220;
      local_208 = height;
      (**(code **)(lVar6 + 0x1310))
                (0x8516,level,internal_format,width,height,0,local_220,local_218,local_210);
      GVar1 = local_208;
      local_204 = level;
      (**(code **)(lVar6 + 0x1310))
                (0x8518,level,internal_format,width,local_208,0,uVar10,uVar11,pGVar12);
      uVar11 = local_218;
      uVar10 = local_220;
      (**(code **)(lVar6 + 0x1310))
                (0x851a,level,internal_format,width,GVar1,0,local_220,local_218,pGVar12);
      GVar2 = local_204;
      (**(code **)(lVar6 + 0x1310))
                (0x8515,local_204,internal_format,width,GVar1,0,uVar10,uVar11,pGVar12);
      height = local_208;
      (**(code **)(lVar6 + 0x1310))
                (0x8517,GVar2,internal_format,width,local_208,0,uVar10,uVar11,pGVar12);
      GVar4 = 0x8513;
      level = local_204;
      GVar9 = 0x8519;
    }
    (**(code **)(lVar6 + 0x1310))(GVar9,level,internal_format,width,height,0,uVar10,uVar11,pGVar12);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    function_name = "TexImage2D";
  }
  else if ((int)GVar4 < 0x8d41) {
    if (GVar4 == 0x8c18) goto LAB_008860fb;
    if (GVar4 == 0x8c1a) {
LAB_00885f2a:
      (**(code **)(lVar6 + 0xb8))(GVar4,name);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x64a);
      (**(code **)(lVar6 + 0x1320))
                (GVar4,level,internal_format,width,height,depth,0,local_220,local_218,local_210);
      iVar3 = (**(code **)(lVar6 + 0x800))();
      function_name = "TexImage3D";
    }
    else {
      if (GVar4 != 0x8c2a) goto LAB_008860ba;
      (**(code **)(lVar6 + 0x6c8))(1,out_buf_id);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"GenBuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x654);
      (**(code **)(lVar6 + 0x40))(0x8c2a,*out_buf_id);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x657);
      lVar8 = 0x10;
      if (local_210 != (GLvoid *)0x0) {
        lVar8 = (long)(int)width;
      }
      (**(code **)(lVar6 + 0x150))(0x8c2a,lVar8,local_210,0x88ea);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BufferData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x664);
      (**(code **)(lVar6 + 0xb8))(0x8c2a,name);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x668);
      (**(code **)(lVar6 + 0x12f8))(0x8c2a,internal_format,*out_buf_id);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      GVar4 = 0x8c2a;
      glu::checkError(dVar5,"TexBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x66b);
      iVar3 = 0;
    }
  }
  else if ((int)GVar4 < 0x9100) {
    if (GVar4 != 0x8d41) {
      if (GVar4 == 0x9009) goto LAB_00885f2a;
LAB_008860ba:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x68d);
      goto LAB_008860e5;
    }
    GVar4 = 0x8d41;
    (**(code **)(lVar6 + 0xa0))(0x8d41,name);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"BindRenderbuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x60f);
    (**(code **)(lVar6 + 0x1238))(0x8d41,internal_format,width,height);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"RenderbufferStorage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x612);
    iVar3 = 0;
    (**(code **)(lVar6 + 0xa0))(0x8d41,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"BindRenderbuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x615);
  }
  else if (GVar4 == 0x9100) {
    GVar4 = 0x9100;
    (**(code **)(lVar6 + 0xb8))(0x9100,name);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x632);
    (**(code **)(lVar6 + 0x1318))(0x9100,1,internal_format,width,height,0);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    function_name = "TexImage2DMultisample";
  }
  else {
    if (GVar4 != 0x9102) goto LAB_008860ba;
    GVar4 = 0x9102;
    (**(code **)(lVar6 + 0xb8))(0x9102,name);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x63c);
    (**(code **)(lVar6 + 0x1328))(0x9102,1,internal_format,width,height,depth,0);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    function_name = "TexImage3DMultisample";
  }
LAB_0088616e:
  if (iVar3 == 0) {
    if (GVar4 != 0x8d41) {
      (**(code **)(lVar6 + 0xb8))(GVar4,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x69f);
      return;
    }
    return;
  }
  local_1b0._0_8_ = local_200->m_testCtx->m_log;
  this = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Error: ",7);
  local_1c0.m_getName = glu::getErrorName;
  local_1c0.m_value = iVar3;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,". Function: ",0xc);
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&function_name);
  stream = &pMVar7->m_str;
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>,". Target: ",10);
  local_1d0.m_getName = glu::getTextureTargetName;
  local_1d0.m_value = GVar4;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1d0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>,". Format: ",10);
  local_1e0.m_getName = glu::getInternalFormatParameterName;
  local_1e0.m_value = internal_format;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1e0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
  local_1f8 = glu::getTextureFormatName((int)local_220);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
  local_1f0.m_getName = glu::getTypeName;
  local_1f0.m_value = (int)local_218;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1f0,&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to create texture",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0x698);
LAB_008860e5:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::prepareTexture(deqp::Context& context, GLuint name, GLenum target, GLenum internal_format, GLenum format,
						   GLenum type, GLuint level, GLuint width, GLuint height, GLuint depth, const GLvoid* pixels,
						   GLuint& out_buf_id)
{
	static const GLint   border		   = 0;
	GLenum				 error		   = 0;
	const GLchar*		 function_name = "unknown";
	const Functions&	 gl			   = context.getRenderContext().getFunctions();
	static const GLsizei samples	   = 1;

	/* Translate proxies into real targets */
	target = transProxyToRealTarget(target);

	/* Initialize */
	switch (target)
	{
	case GL_RENDERBUFFER:
		gl.bindRenderbuffer(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		gl.renderbufferStorage(target, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderbufferStorage");

		gl.bindRenderbuffer(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		break;

	case GL_TEXTURE_1D:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage1D(target, level, internal_format, width, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage1D";

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(target, level, internal_format, width, height, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2DMultisample(target, samples, internal_format, width, height, GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage2DMultisample";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3DMultisample(target, samples, internal_format, width, height, depth,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage3DMultisample";

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3D(target, level, internal_format, width, height, depth, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage3D";

		break;

	case GL_TEXTURE_BUFFER:
		gl.genBuffers(1, &out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

		gl.bindBuffer(GL_TEXTURE_BUFFER, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		{
			GLsizei		  size = 16;
			const GLvoid* data = 0;

			if (0 != pixels)
			{
				size = width;
				data = pixels;
			}

			gl.bufferData(GL_TEXTURE_BUFFER, size, data, GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");
		}

		gl.bindTexture(GL_TEXTURE_BUFFER, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texBuffer(GL_TEXTURE_BUFFER, internal_format, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexBuffer");

		break;

	case GL_TEXTURE_CUBE_MAP:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
		/* Change target to CUBE_MAP, it will be used later to change base and max level */
		target = GL_TEXTURE_CUBE_MAP;
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	if (GL_NO_ERROR != error)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error: " << glu::getErrorStr(error) << ". Function: " << function_name
			<< ". Target: " << glu::getTextureTargetStr(target)
			<< ". Format: " << glu::getInternalFormatParameterStr(internal_format) << ", "
			<< glu::getTextureFormatName(format) << ", " << glu::getTypeStr(type) << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to create texture");
	}

	if (GL_RENDERBUFFER != target)
	{
		/* Clean binding point */
		gl.bindTexture(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
}